

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O1

mbedtls_mpi_uint mbedtls_mpi_core_montmul_init(mbedtls_mpi_uint *N)

{
  mbedtls_mpi_uint mVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  
  mVar1 = *N;
  lVar3 = ((int)mVar1 * 2 + 4U & 8) + mVar1;
  uVar4 = 0x40;
  do {
    lVar3 = (2 - lVar3 * mVar1) * lVar3;
    bVar2 = 0xf < uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  return -lVar3;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_montmul_init(const mbedtls_mpi_uint *N)
{
    mbedtls_mpi_uint x = N[0];

    x += ((N[0] + 2) & 4) << 1;

    for (unsigned int i = biL; i >= 8; i /= 2) {
        x *= (2 - (N[0] * x));
    }

    return ~x + 1;
}